

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_muli_i64_x86_64(TCGContext *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,int64_t arg2)

{
  int64_t arg2_00;
  TCGv_i64 arg2_01;
  uintptr_t o;
  
  if (arg2 == 0) {
    tcg_gen_movi_i64_x86_64(tcg_ctx,ret,0);
    return;
  }
  if ((arg2 & arg2 - 1U) == 0) {
    arg2_00 = 0;
    if (arg2 != 0) {
      for (; ((ulong)arg2 >> arg2_00 & 1) == 0; arg2_00 = arg2_00 + 1) {
      }
    }
    tcg_gen_shli_i64_x86_64(tcg_ctx,ret,arg1,arg2_00);
    return;
  }
  arg2_01 = tcg_const_i64_x86_64(tcg_ctx,arg2);
  tcg_gen_mul_i64_x86_64(tcg_ctx,ret,arg1,arg2_01);
  tcg_temp_free_internal_x86_64(tcg_ctx,(TCGTemp *)(arg2_01 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_muli_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, int64_t arg2)
{
    if (arg2 == 0) {
        tcg_gen_movi_i64(tcg_ctx, ret, 0);
    } else if (is_power_of_2(arg2)) {
        tcg_gen_shli_i64(tcg_ctx, ret, arg1, ctz64(arg2));
    } else {
        TCGv_i64 t0 = tcg_const_i64(tcg_ctx, arg2);
        tcg_gen_mul_i64(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
    }
}